

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O0

void __thiscall Container::wait_for_slave(Container *this)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  uint32_t interval;
  uint uVar4;
  Config *this_00;
  ContextManager *pCVar5;
  TaskData *pTVar6;
  time_ms_t tVar7;
  memory_kb_t mVar8;
  allocator<char> local_69;
  string local_68 [48];
  string local_38;
  __pid_t local_18;
  uint local_14;
  pid_t pid;
  int status;
  Container *this_local;
  
  _pid = this;
  this_00 = Config::get();
  interval = Config::get_timer_interval_ms(this_00);
  start_timer(interval);
  reset_wall_clock(this);
  do {
    do {
      local_18 = waitpid(this->slave_pid_,(int *)&local_14,0);
      if (local_18 == this->slave_pid_) {
        kill_all(this);
        if ((local_14 & 0x7f) == 0) {
          pTVar6 = SharedMemoryObject<TaskData>::operator->(&this->task_data_);
          pTVar6->exited = true;
          uVar4 = local_14 & 0xff00;
          pTVar6 = SharedMemoryObject<TaskData>::operator->(&this->task_data_);
          pTVar6->exit_code = (int)uVar4 >> 8;
        }
        if ('\0' < (char)(((byte)local_14 & 0x7f) + 1) >> 1) {
          pTVar6 = SharedMemoryObject<TaskData>::operator->(&this->task_data_);
          pTVar6->signaled = true;
          pTVar6 = SharedMemoryObject<TaskData>::operator->(&this->task_data_);
          pTVar6->term_signal = local_14 & 0x7f;
        }
        goto LAB_0013310c;
      }
      if ((timer_interrupt & 1U) == 0) {
        pCVar5 = ContextManager::get();
        format_abi_cxx11_(&local_38,"waitpid() failed: %m");
        (**pCVar5->_vptr_ContextManager)(pCVar5,&local_38);
        std::__cxx11::string::~string((string *)&local_38);
      }
      timer_interrupt = false;
      pTVar6 = SharedMemoryObject<TaskData>::operator->(&this->task_data_);
      if (pTVar6->time_limit_ms != -1) {
        tVar7 = get_time_usage_ms(this);
        pTVar6 = SharedMemoryObject<TaskData>::operator->(&this->task_data_);
        if (pTVar6->time_limit_ms < tVar7) {
          kill_all(this);
          goto LAB_0013310c;
        }
      }
      pTVar6 = SharedMemoryObject<TaskData>::operator->(&this->task_data_);
    } while (pTVar6->wall_time_limit_ms == -1);
    tVar7 = get_wall_clock_ms(this);
    pTVar6 = SharedMemoryObject<TaskData>::operator->(&this->task_data_);
  } while (tVar7 <= pTVar6->wall_time_limit_ms);
  kill_all(this);
LAB_0013310c:
  stop_timer();
  tVar7 = get_time_usage_ms(this);
  pTVar6 = SharedMemoryObject<TaskData>::operator->(&this->task_data_);
  pTVar6->time_usage_ms = tVar7;
  tVar7 = get_time_usage_sys_ms(this);
  pTVar6 = SharedMemoryObject<TaskData>::operator->(&this->task_data_);
  pTVar6->time_usage_sys_ms = tVar7;
  tVar7 = get_time_usage_user_ms(this);
  pTVar6 = SharedMemoryObject<TaskData>::operator->(&this->task_data_);
  pTVar6->time_usage_user_ms = tVar7;
  tVar7 = get_wall_clock_ms(this);
  pTVar6 = SharedMemoryObject<TaskData>::operator->(&this->task_data_);
  pTVar6->wall_time_usage_ms = tVar7;
  mVar8 = get_memory_usage_kb(this);
  pTVar6 = SharedMemoryObject<TaskData>::operator->(&this->task_data_);
  pTVar6->memory_usage_kb = mVar8;
  bVar3 = is_oom_killed(this);
  pTVar6 = SharedMemoryObject<TaskData>::operator->(&this->task_data_);
  pTVar6->oom_killed = bVar3;
  bVar3 = is_memory_limit_hit(this);
  pTVar6 = SharedMemoryObject<TaskData>::operator->(&this->task_data_);
  pTVar6->memory_limit_hit = bVar3;
  pTVar6 = SharedMemoryObject<TaskData>::operator->(&this->task_data_);
  if (pTVar6->time_limit_ms != -1) {
    pTVar6 = SharedMemoryObject<TaskData>::operator->(&this->task_data_);
    lVar1 = pTVar6->time_usage_ms;
    pTVar6 = SharedMemoryObject<TaskData>::operator->(&this->task_data_);
    lVar2 = pTVar6->time_limit_ms;
    pTVar6 = SharedMemoryObject<TaskData>::operator->(&this->task_data_);
    pTVar6->time_limit_exceeded = lVar2 < lVar1;
  }
  pTVar6 = SharedMemoryObject<TaskData>::operator->(&this->task_data_);
  if (pTVar6->wall_time_limit_ms != -1) {
    pTVar6 = SharedMemoryObject<TaskData>::operator->(&this->task_data_);
    lVar1 = pTVar6->wall_time_usage_ms;
    pTVar6 = SharedMemoryObject<TaskData>::operator->(&this->task_data_);
    lVar2 = pTVar6->wall_time_limit_ms;
    pTVar6 = SharedMemoryObject<TaskData>::operator->(&this->task_data_);
    pTVar6->wall_time_limit_exceeded = lVar2 < lVar1;
  }
  pTVar6 = SharedMemoryObject<TaskData>::operator->(&this->task_data_);
  if ((pTVar6->error & 1U) != 0) {
    pCVar5 = ContextManager::get();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_68,"Slave exited with error",&local_69)
    ;
    (**pCVar5->_vptr_ContextManager)(pCVar5,local_68);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator(&local_69);
  }
  return;
}

Assistant:

void Container::wait_for_slave() {
    start_timer(Config::get().get_timer_interval_ms());
    reset_wall_clock();

    while (true) {
        int status;
        pid_t pid = waitpid(slave_pid_, &status, 0);
        if (pid != slave_pid_) {
            if (!timer_interrupt) {
                die(format("waitpid() failed: %m"));
            }

            timer_interrupt = false;

            if (task_data_->time_limit_ms != -1 && get_time_usage_ms() > task_data_->time_limit_ms) {
                kill_all();
                break;
            }

            if (task_data_->wall_time_limit_ms != -1 && get_wall_clock_ms() > task_data_->wall_time_limit_ms) {
                kill_all();
                break;
            }

            continue;
        }

        kill_all();

        if (WIFEXITED(status)) {
            task_data_->exited = true;
            task_data_->exit_code = WEXITSTATUS(status);
        }
        if (WIFSIGNALED(status)) {
            task_data_->signaled = true;
            task_data_->term_signal = WTERMSIG(status);
        }

        break;
    }

    stop_timer();

    task_data_->time_usage_ms = get_time_usage_ms();
    task_data_->time_usage_sys_ms = get_time_usage_sys_ms();
    task_data_->time_usage_user_ms = get_time_usage_user_ms();
    task_data_->wall_time_usage_ms = get_wall_clock_ms();
    task_data_->memory_usage_kb = get_memory_usage_kb();
    task_data_->oom_killed = is_oom_killed();
    task_data_->memory_limit_hit = is_memory_limit_hit();
    if (task_data_->time_limit_ms != -1) {
        task_data_->time_limit_exceeded = (task_data_->time_usage_ms > task_data_->time_limit_ms);
    }
    if (task_data_->wall_time_limit_ms != -1) {
        task_data_->wall_time_limit_exceeded = (task_data_->wall_time_usage_ms > task_data_->wall_time_limit_ms);
    }

    if (task_data_->error) {
        die("Slave exited with error");
    }
}